

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O3

size_t __thiscall
Memory::LargeHeapBlock::Rescan
          (LargeHeapBlock *this,Recycler *recycler,bool isPartialSwept,RescanFlags flags)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  size_t sVar5;
  RescanFlags extraout_EDX;
  RescanFlags extraout_EDX_00;
  RescanFlags flags_00;
  undefined7 in_register_00000011;
  undefined8 *in_FS_OFFSET;
  
  flags_00 = (RescanFlags)CONCAT71(in_register_00000011,isPartialSwept);
  this->lastCollectAllocCount = this->allocCount;
  if (((flags & RescanFlags_ResetWriteWatch) == RescanFlags_None) &&
     ((recycler->collectionState).value == CollectionStateConcurrentFinishMark)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x551,
                       "(recycler->collectionState != CollectionStateConcurrentFinishMark || (flags & RescanFlags_ResetWriteWatch))"
                       ,
                       "recycler->collectionState != CollectionStateConcurrentFinishMark || (flags & RescanFlags_ResetWriteWatch)"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
    flags_00 = extraout_EDX;
  }
  if (this->pageCount != 1) {
    if (((recycler->collectionState).value != CollectionStateConcurrentFinishMark) &&
       (BVar4 = Recycler::IsConcurrentMarkState(recycler), flags_00 = extraout_EDX_00, BVar4 != 0))
    {
      return 0;
    }
    sVar5 = RescanMultiPage(this,recycler,flags_00);
    return sVar5;
  }
  bVar3 = RescanOnePage(this,recycler,flags_00);
  return (ulong)bVar3;
}

Assistant:

size_t
LargeHeapBlock::Rescan(Recycler * recycler, bool isPartialSwept, RescanFlags flags)
{
    // Update the lastCollectAllocCount for sweep
    this->lastCollectAllocCount = this->allocCount;

#if ENABLE_CONCURRENT_GC
    Assert(recycler->collectionState != CollectionStateConcurrentFinishMark || (flags & RescanFlags_ResetWriteWatch));
    if (this->GetPageCount() == 1)
    {
        return RescanOnePage(recycler, flags);
    }

    // Need to rescan for finish mark even if it is done on the background thread
    if (recycler->collectionState != CollectionStateConcurrentFinishMark && recycler->IsConcurrentMarkState())
    {
        // CONCURRENT-TODO: Don't do background rescan for pages with multiple pages because
        // we don't track which page we have queued up
        return 0;
    }
    return RescanMultiPage(recycler, flags);
#else
    return this->GetPageCount() == 1 ? RescanOnePage(recycler) : RescanMultiPage(recycler);
#endif
}